

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O0

void __thiscall
SemanticAnalyserTest_UndeclaredFunctionCallInReturnThrows_Test::
~SemanticAnalyserTest_UndeclaredFunctionCallInReturnThrows_Test
          (SemanticAnalyserTest_UndeclaredFunctionCallInReturnThrows_Test *this)

{
  void *in_RDI;
  
  ~SemanticAnalyserTest_UndeclaredFunctionCallInReturnThrows_Test
            ((SemanticAnalyserTest_UndeclaredFunctionCallInReturnThrows_Test *)0x1e8f18);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, UndeclaredFunctionCallInReturnThrows)
{
  std::string source = R"SRC(
  fn f(): f32 { ret test(); }

  fn main(): f32
  {
    ret 0;
  }
  )SRC";
  throwTest(source);
}